

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ButtonEx(char *label,ImVec2 *size_arg,ImGuiButtonFlags flags)

{
  undefined8 uVar1;
  ImVec2 p_max;
  ImVec2 p_min;
  ImGuiContext *pIVar2;
  bool bVar3;
  byte bVar4;
  float fVar5;
  ImU32 IVar6;
  ImGuiWindow *pIVar7;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  ImRect *unaff_retaddr;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImVec2 size;
  ImVec2 pos;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff60;
  ImVec2 in_stack_ffffffffffffff68;
  ImGuiWindow *in_stack_ffffffffffffff70;
  ImRect *in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  ImVec2 IVar13;
  ImVec2 in_stack_ffffffffffffff90;
  ImVec2 text;
  ImVec2 in_stack_ffffffffffffff98;
  ImVec2 *pos_min;
  undefined4 in_stack_ffffffffffffffa8;
  float rounding;
  undefined4 uVar14;
  float fill_col;
  float fVar15;
  float fVar16;
  float fVar17;
  ImGuiNavHighlightFlags in_stack_fffffffffffffff8;
  ImGuiID in_stack_fffffffffffffffc;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  pIVar7 = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((pIVar7->SkipItems & 1U) == 0) {
    fVar5 = (float)ImGuiWindow::GetID(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                                      in_stack_ffffffffffffff60);
    auVar8._0_8_ = CalcTextSize((char *)in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,
                                in_stack_ffffffffffffff68.y._3_1_,in_stack_ffffffffffffff68.x);
    auVar8._8_56_ = extraout_var;
    uVar1 = vmovlpd_avx(auVar8._0_16_);
    fVar16 = (float)uVar1;
    fVar17 = (float)((ulong)uVar1 >> 0x20);
    IVar13 = (pIVar7->DC).CursorPos;
    fill_col = IVar13.x;
    fVar15 = IVar13.y;
    if (((in_EDX & 0x8000) != 0) &&
       ((pIVar2->Style).FramePadding.y < (pIVar7->DC).CurrLineTextBaseOffset)) {
      fVar15 = ((pIVar7->DC).CurrLineTextBaseOffset - (pIVar2->Style).FramePadding.y) + fVar15;
    }
    pos_min = (ImVec2 *)*in_RSI;
    auVar9._0_8_ = CalcItemSize(in_stack_ffffffffffffff68,
                                (float)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                                SUB84(in_stack_ffffffffffffff60,0));
    auVar9._8_56_ = extraout_var_00;
    uVar1 = vmovlpd_avx(auVar9._0_16_);
    rounding = (float)uVar1;
    uVar14 = (undefined4)((ulong)uVar1 >> 0x20);
    auVar10._0_8_ = ::operator+(in_stack_ffffffffffffff48,(ImVec2 *)0x1e1ba7);
    auVar10._8_56_ = extraout_var_01;
    IVar13 = (ImVec2)vmovlpd_avx(auVar10._0_16_);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff90,(ImVec2 *)&stack0xffffffffffffffb4,
                   (ImVec2 *)&stack0xffffffffffffff88);
    ItemSize((ImVec2 *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68.y);
    bVar3 = ItemAdd(in_stack_ffffffffffffff78,(ImGuiID)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                    (ImRect *)in_stack_ffffffffffffff68);
    if (bVar3) {
      bVar4 = ButtonBehavior((ImRect *)CONCAT44(rounding,in_stack_ffffffffffffffa8),
                             (ImGuiID)((ulong)pos_min >> 0x20),(bool *)in_stack_ffffffffffffff98,
                             (bool *)in_stack_ffffffffffffff90,(ImGuiButtonFlags)IVar13.y);
      IVar6 = GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                          SUB84(in_stack_ffffffffffffff60,0));
      RenderNavHighlight(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8);
      p_min.y = fVar5;
      p_min.x = fVar17;
      p_max.y = fVar16;
      p_max.x = fVar15;
      text = in_stack_ffffffffffffff90;
      RenderFrame(p_min,p_max,(ImU32)fill_col,SUB41((uint)uVar14 >> 0x18,0),rounding);
      if ((pIVar2->LogEnabled & 1U) != 0) {
        LogSetNextTextDecoration("[","]");
      }
      auVar11._0_8_ = ::operator+(in_stack_ffffffffffffff48,(ImVec2 *)0x1e1d18);
      auVar11._8_56_ = extraout_var_02;
      vmovlpd_avx(auVar11._0_16_);
      auVar12._0_8_ = ::operator-(in_stack_ffffffffffffff48,(ImVec2 *)0x1e1d34);
      auVar12._8_56_ = extraout_var_03;
      vmovlpd_avx(auVar12._0_16_);
      RenderTextClipped(pos_min,(ImVec2 *)in_stack_ffffffffffffff98,(char *)text,(char *)IVar13,
                        (ImVec2 *)
                        CONCAT17(in_stack_ffffffffffffff87,
                                 CONCAT16(in_stack_ffffffffffffff86,
                                          CONCAT15(bVar4,CONCAT14(in_stack_ffffffffffffff84,IVar6)))
                                ),(ImVec2 *)in_stack_ffffffffffffff90,
                        (ImRect *)CONCAT44(fill_col,uVar14));
      bVar3 = (bool)(bVar4 & 1);
    }
    else {
      bVar3 = false;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::ButtonEx(const char* label, const ImVec2& size_arg, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    ImVec2 pos = window->DC.CursorPos;
    if ((flags & ImGuiButtonFlags_AlignTextBaseLine) && style.FramePadding.y < window->DC.CurrLineTextBaseOffset) // Try to vertically align buttons that are smaller/have no padding so that text baseline matches (bit hacky, since it shouldn't be a flag)
        pos.y += window->DC.CurrLineTextBaseOffset - style.FramePadding.y;
    ImVec2 size = CalcItemSize(size_arg, label_size.x + style.FramePadding.x * 2.0f, label_size.y + style.FramePadding.y * 2.0f);

    const ImRect bb(pos, pos + size);
    ItemSize(size, style.FramePadding.y);
    if (!ItemAdd(bb, id))
        return false;

    if (window->DC.ItemFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, style.FrameRounding);

    if (g.LogEnabled)
        LogSetNextTextDecoration("[", "]");
    RenderTextClipped(bb.Min + style.FramePadding, bb.Max - style.FramePadding, label, NULL, &label_size, style.ButtonTextAlign, &bb);

    // Automatically close popups
    //if (pressed && !(flags & ImGuiButtonFlags_DontClosePopups) && (window->Flags & ImGuiWindowFlags_Popup))
    //    CloseCurrentPopup();

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    return pressed;
}